

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry.c
# Opt level: O0

char * stumpless_get_entry_app_name(stumpless_entry *entry)

{
  char *app_name_copy;
  stumpless_entry *entry_local;
  
  if (entry == (stumpless_entry *)0x0) {
    raise_argument_empty("entry was NULL");
    entry_local = (stumpless_entry *)0x0;
  }
  else {
    lock_entry(entry);
    entry_local = (stumpless_entry *)alloc_mem(entry->app_name_length + 1);
    if (entry_local != (stumpless_entry *)0x0) {
      memcpy(entry_local,entry->app_name,entry->app_name_length + 1);
      clear_error();
    }
    unlock_entry(entry);
  }
  return (char *)entry_local;
}

Assistant:

const char *
stumpless_get_entry_app_name( const struct stumpless_entry *entry ) {
  char *app_name_copy;

  VALIDATE_ARG_NOT_NULL( entry );

  lock_entry( entry );
  app_name_copy = alloc_mem( entry->app_name_length + 1 );
  if( !app_name_copy ) {
    goto cleanup_and_return;
  }
  memcpy( app_name_copy, entry->app_name, entry->app_name_length + 1 );
  clear_error(  );

cleanup_and_return:
  unlock_entry( entry );
  return app_name_copy;
}